

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::slot_type<S2BooleanOperation::SourceId,int>::
     construct<std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,std::piecewise_construct_t_const&,std::tuple<S2BooleanOperation::SourceId_const&>,std::tuple<>>
               (allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_> *alloc,
               slot_type<S2BooleanOperation::SourceId,_int> *slot,piecewise_construct_t *args,
               tuple<const_S2BooleanOperation::SourceId_&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<const_S2BooleanOperation::SourceId_&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type<S2BooleanOperation::SourceId,_int> *slot_local;
  allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_> *alloc_local;
  
  slot_type<S2BooleanOperation::SourceId,_int>::emplace(slot);
  allocator_traits<std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>>::
  construct<std::pair<S2BooleanOperation::SourceId,int>,std::piecewise_construct_t_const&,std::tuple<S2BooleanOperation::SourceId_const&>,std::tuple<>>
            (alloc,(pair<S2BooleanOperation::SourceId,_int> *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }